

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O0

bool read_pbm_header(QIODevice *device,char *type,int *w,int *h,int *mcc)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int *in_RCX;
  bool *in_RDX;
  QIODevice *in_RSI;
  char *in_RDI;
  int *in_R8;
  long in_FS_OFFSET;
  bool ok;
  char buf [3];
  bool local_d;
  undefined2 local_b;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_b = 0xaaaa;
  local_9 = 0xaa;
  lVar3 = QIODevice::read(in_RDI,(longlong)&local_b);
  if (lVar3 == 3) {
    if ((char)local_b == 'P') {
      bVar1 = QtMiscUtils::isAsciiDigit((int)(char)local_b._1_1_);
      if ((bVar1) && (bVar1 = ascii_isspace('\0'), bVar1)) {
        *in_RSI = local_b._1_1_;
        if (((char)*in_RSI < '1') || ('6' < (char)*in_RSI)) {
          local_d = false;
        }
        else {
          iVar2 = read_pbm_int(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20));
          *(int *)in_RDX = iVar2;
          iVar2 = read_pbm_int(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20));
          *in_RCX = iVar2;
          if ((*in_RSI == (QIODevice)0x31) || (*in_RSI == (QIODevice)0x34)) {
            *in_R8 = 1;
          }
          else {
            iVar2 = read_pbm_int(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20));
            *in_R8 = iVar2;
          }
          if ((((*(int *)in_RDX < 1) || (0x7fff < *(int *)in_RDX)) || (*in_RCX < 1)) ||
             (((0x7fff < *in_RCX || (*in_R8 < 1)) || (0xffff < *in_R8)))) {
            local_d = false;
          }
          else {
            local_d = true;
          }
        }
        goto LAB_00330e11;
      }
    }
    local_d = false;
  }
  else {
    local_d = false;
  }
LAB_00330e11:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_d;
  }
  __stack_chk_fail();
}

Assistant:

static bool read_pbm_header(QIODevice *device, char& type, int& w, int& h, int& mcc)
{
    char buf[3];
    if (device->read(buf, 3) != 3)                        // read P[1-6]<white-space>
        return false;

    if (!(buf[0] == 'P' && QtMiscUtils::isAsciiDigit(buf[1]) && ascii_isspace(buf[2])))
        return false;

    type = buf[1];
    if (type < '1' || type > '6')
        return false;

    bool ok = true;
    w = read_pbm_int(device, &ok);                // get image width
    h = read_pbm_int(device, &ok);                // get image height

    if (type == '1' || type == '4')
        mcc = 1;                                  // ignore max color component
    else
        mcc = read_pbm_int(device, &ok);          // get max color component

    if (!ok || w <= 0 || w > 32767 || h <= 0 || h > 32767 || mcc <= 0 || mcc > 0xffff)
        return false;                             // weird P.M image

    return true;
}